

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O3

bool TestHighbitsCollisions<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *hashes)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  byte bVar4;
  byte bVar5;
  uint __exponent;
  uint uVar6;
  ulong in_RCX;
  ulong uVar7;
  ulong uVar8;
  int in_ESI;
  ulong uVar9;
  int nbHashes;
  uint uVar10;
  bool bVar11;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  double in_XMM0_Qa;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  double local_50;
  double local_48;
  
  nbHashes = (int)((ulong)((long)(hashes->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(hashes->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
  __exponent = FindMinBits_TargetCollisionShare(nbHashes,in_XMM0_Qa);
  uVar6 = FindMaxBits_TargetCollisionNb(nbHashes,in_ESI);
  if ((int)uVar6 < 0x20) {
    uVar9 = 0;
    printf("Testing collisions (high %2i-%2i bits) - ",(ulong)__exponent,(ulong)uVar6);
    if ((int)uVar6 < (int)__exponent) {
      printf("Worst is %2i bits: %2i/%2i (%.2fx)",0,0,0,1);
    }
    else {
      auVar23._0_8_ = (double)nbHashes;
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar10 = 0;
      local_48 = 1.0;
      local_50 = 0.0;
      do {
        puVar1 = (hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = 0;
        uVar7 = (long)(hashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
        if (1 < uVar7) {
          auVar24 = ZEXT1664((undefined1  [16])0x0);
          auVar16 = vpbroadcastq_avx512f();
          in_RCX = uVar7 + 0xe & 0xfffffffffffffff0;
          uVar7 = 0;
          auVar17 = vpbroadcastd_avx512f();
          do {
            auVar18 = vpbroadcastq_avx512f();
            auVar19 = vporq_avx512f(auVar18,auVar14);
            auVar18 = vporq_avx512f(auVar18,auVar15);
            uVar3 = vpcmpuq_avx512f(auVar18,auVar16,2);
            bVar4 = (byte)uVar3;
            uVar3 = vpcmpuq_avx512f(auVar19,auVar16,2);
            bVar5 = (byte)uVar3;
            uVar12 = CONCAT11(bVar5,bVar4);
            auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar1 + uVar7 + 1));
            auVar19._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar18._4_4_;
            auVar19._0_4_ = (uint)(bVar4 & 1) * auVar18._0_4_;
            auVar19._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar18._8_4_;
            auVar19._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar18._12_4_;
            auVar19._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar18._16_4_;
            auVar19._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar18._20_4_;
            auVar19._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar18._24_4_;
            auVar19._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar18._28_4_;
            auVar19._32_4_ = (uint)(bVar5 & 1) * auVar18._32_4_;
            auVar19._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar18._36_4_;
            auVar19._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar18._40_4_;
            auVar19._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar18._44_4_;
            auVar19._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar18._48_4_;
            auVar19._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar18._52_4_;
            auVar19._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar18._56_4_;
            auVar19._60_4_ = (uint)(bVar5 >> 7) * auVar18._60_4_;
            auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar1 + uVar7));
            auVar20._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar18._4_4_;
            auVar20._0_4_ = (uint)(bVar4 & 1) * auVar18._0_4_;
            auVar20._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar18._8_4_;
            auVar20._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar18._12_4_;
            auVar20._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar18._16_4_;
            auVar20._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar18._20_4_;
            auVar20._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar18._24_4_;
            auVar20._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar18._28_4_;
            auVar20._32_4_ = (uint)(bVar5 & 1) * auVar18._32_4_;
            auVar20._36_4_ = (uint)(bVar5 >> 1 & 1) * auVar18._36_4_;
            auVar20._40_4_ = (uint)(bVar5 >> 2 & 1) * auVar18._40_4_;
            auVar20._44_4_ = (uint)(bVar5 >> 3 & 1) * auVar18._44_4_;
            auVar20._48_4_ = (uint)(bVar5 >> 4 & 1) * auVar18._48_4_;
            auVar20._52_4_ = (uint)(bVar5 >> 5 & 1) * auVar18._52_4_;
            auVar20._56_4_ = (uint)(bVar5 >> 6 & 1) * auVar18._56_4_;
            auVar20._60_4_ = (uint)(bVar5 >> 7) * auVar18._60_4_;
            uVar7 = uVar7 + 0x10;
            auVar18 = vpsrlvd_avx512f(auVar20,auVar17);
            auVar19 = vpsrlvd_avx512f(auVar19,auVar17);
            auVar20 = vmovdqa64_avx512f(auVar24);
            uVar3 = vpcmpeqd_avx512f(auVar18,auVar19);
            auVar24 = vpmovm2d_avx512dq(uVar3);
            auVar24 = vpsubd_avx512f(auVar20,auVar24);
          } while (in_RCX != uVar7);
          auVar14 = vmovdqa32_avx512f(auVar24);
          auVar15._0_4_ =
               (uint)(bVar4 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar4 & 1) * auVar20._0_4_;
          bVar11 = (bool)((byte)(uVar12 >> 1) & 1);
          auVar15._4_4_ = (uint)bVar11 * auVar14._4_4_ | (uint)!bVar11 * auVar20._4_4_;
          bVar11 = (bool)((byte)(uVar12 >> 2) & 1);
          auVar15._8_4_ = (uint)bVar11 * auVar14._8_4_ | (uint)!bVar11 * auVar20._8_4_;
          bVar11 = (bool)((byte)(uVar12 >> 3) & 1);
          auVar15._12_4_ = (uint)bVar11 * auVar14._12_4_ | (uint)!bVar11 * auVar20._12_4_;
          bVar11 = (bool)((byte)(uVar12 >> 4) & 1);
          auVar15._16_4_ = (uint)bVar11 * auVar14._16_4_ | (uint)!bVar11 * auVar20._16_4_;
          bVar11 = (bool)((byte)(uVar12 >> 5) & 1);
          auVar15._20_4_ = (uint)bVar11 * auVar14._20_4_ | (uint)!bVar11 * auVar20._20_4_;
          bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
          auVar15._24_4_ = (uint)bVar11 * auVar14._24_4_ | (uint)!bVar11 * auVar20._24_4_;
          bVar11 = (bool)((byte)(uVar12 >> 7) & 1);
          auVar15._28_4_ = (uint)bVar11 * auVar14._28_4_ | (uint)!bVar11 * auVar20._28_4_;
          auVar15._32_4_ =
               (uint)(bVar5 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar5 & 1) * auVar20._32_4_;
          bVar11 = (bool)(bVar5 >> 1 & 1);
          auVar15._36_4_ = (uint)bVar11 * auVar14._36_4_ | (uint)!bVar11 * auVar20._36_4_;
          bVar11 = (bool)(bVar5 >> 2 & 1);
          auVar15._40_4_ = (uint)bVar11 * auVar14._40_4_ | (uint)!bVar11 * auVar20._40_4_;
          bVar11 = (bool)(bVar5 >> 3 & 1);
          auVar15._44_4_ = (uint)bVar11 * auVar14._44_4_ | (uint)!bVar11 * auVar20._44_4_;
          bVar11 = (bool)(bVar5 >> 4 & 1);
          auVar15._48_4_ = (uint)bVar11 * auVar14._48_4_ | (uint)!bVar11 * auVar20._48_4_;
          bVar11 = (bool)(bVar5 >> 5 & 1);
          auVar15._52_4_ = (uint)bVar11 * auVar14._52_4_ | (uint)!bVar11 * auVar20._52_4_;
          bVar11 = (bool)(bVar5 >> 6 & 1);
          auVar15._56_4_ = (uint)bVar11 * auVar14._56_4_ | (uint)!bVar11 * auVar20._56_4_;
          auVar15._60_4_ =
               (uint)(bVar5 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar5 >> 7) * auVar20._60_4_;
          auVar13 = vextracti64x4_avx512f(auVar15,1);
          auVar14 = vpaddd_avx512f(auVar15,ZEXT3264(auVar13));
          auVar22 = vpaddd_avx(auVar14._0_16_,auVar14._16_16_);
          auVar2 = vpshufd_avx(auVar22,0xee);
          auVar22 = vpaddd_avx(auVar22,auVar2);
          auVar2 = vpshufd_avx(auVar22,0x55);
          auVar22 = vpaddd_avx(auVar22,auVar2);
          uVar8 = (ulong)auVar22._0_4_;
        }
        dVar21 = ldexp(1.0,__exponent);
        auVar22._0_8_ = (auVar23._0_8_ * (double)(nbHashes + -1)) / dVar21;
        auVar22._8_8_ = 0;
        auVar23._8_8_ = 0;
        auVar22 = vminsd_avx(auVar23,auVar22);
        dVar21 = (double)(int)uVar8 / auVar22._0_8_;
        if (local_50 < dVar21) {
          uVar9 = uVar8;
          uVar10 = __exponent;
          local_50 = dVar21;
          local_48 = auVar22._0_8_;
        }
        auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        bVar11 = __exponent != uVar6;
        __exponent = __exponent + 1;
      } while (bVar11);
      printf("Worst is %2i bits: %2i/%2i (%.2fx)",(ulong)uVar10,uVar9,
             CONCAT44((int)(in_RCX >> 0x20),(int)local_48));
      if (2.0 < local_50) {
        puts(" !!!!!");
        return false;
      }
    }
    putchar(10);
  }
  return true;
}

Assistant:

bool TestHighbitsCollisions ( std::vector<hashtype> & hashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = hashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits >= origBits) return true;

  printf("Testing collisions (high %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(hashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}